

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

size_t str_format(char *dst,size_t size,char *format,char **params,size_t nparams)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  size_t __n;
  bool bVar10;
  bool bVar11;
  
  pcVar3 = format;
  if (*format == '\0') {
    sVar8 = 0;
  }
  else {
    sVar8 = 0;
    do {
      pcVar3 = strpbrk(pcVar3,"{\\");
      if (pcVar3 == (char *)0x0) {
        lVar6 = strlcpy(dst,format,size);
        sVar8 = lVar6 + sVar8;
        pcVar3 = (char *)0x0;
        break;
      }
      uVar7 = (long)pcVar3 - (long)format;
      if (size == 0) {
        size = 0;
      }
      else {
        uVar5 = size - 1;
        if (uVar7 < size) {
          uVar5 = uVar7;
        }
        strlcpy(dst,format,uVar5 + 1);
        dst = dst + uVar5;
        size = size - uVar5;
      }
      sVar8 = uVar7 + sVar8;
      if (*pcVar3 == '{') {
        pcVar4 = strchr(pcVar3,0x7d);
        if (pcVar4 == (char *)0x0) {
          format = (char *)0x0;
          pcVar9 = pcVar3;
        }
        else {
          __n = (long)pcVar4 - (long)(pcVar3 + 1);
          if (nparams == 0) {
            pcVar9 = (char *)0x0;
          }
          else {
            pcVar9 = (char *)0x0;
            lVar6 = 0;
            do {
              pcVar1 = params[lVar6];
              iVar2 = strncmp(pcVar1,pcVar3 + 1,__n);
              if (iVar2 == 0) {
                pcVar1 = pcVar1 + __n;
                bVar10 = *pcVar1 == '\0';
                if (bVar10) {
                  pcVar9 = pcVar1 + 1;
                }
              }
              else {
                bVar10 = false;
              }
            } while ((!bVar10) && (bVar10 = nparams - 1 != lVar6, lVar6 = lVar6 + 1, bVar10));
          }
          uVar7 = size - 1;
          if (pcVar9 == (char *)0x0) {
            uVar5 = __n + 2;
            if (uVar5 < size) {
              uVar7 = uVar5;
            }
            strlcpy(dst,pcVar3,uVar7 + 1);
            size = size - uVar7;
          }
          else {
            uVar5 = strlcpy(dst,pcVar9,size);
            bVar10 = size < uVar5;
            size = size - uVar5;
            bVar11 = size != 0;
            if (bVar10) {
              size = 0;
            }
            if (!bVar10 && bVar11) {
              uVar7 = uVar5;
            }
          }
          dst = dst + uVar7;
          sVar8 = sVar8 + uVar5;
          format = pcVar4 + 1;
          pcVar9 = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
      }
      else {
        pcVar9 = pcVar3 + 1;
        if (pcVar3[1] == '\0') {
          pcVar9 = pcVar3;
        }
        if (1 < size) {
          *dst = *pcVar9;
          dst = dst + 1;
          size = size - 1;
        }
        sVar8 = sVar8 + 1;
        format = pcVar9 + 1;
      }
      pcVar3 = pcVar9 + 1;
    } while (pcVar9[1] != '\0');
  }
  if (format < pcVar3) {
    lVar6 = strlcpy(dst,format,size);
    sVar8 = sVar8 + lVar6;
  }
  return sVar8;
}

Assistant:

size_t str_format(char *dst, size_t size, const char *format, const char *params[], size_t nparams)
{
    const char *pos, *copy = format;
    char *write = dst;

    size_t space = size;
    size_t space_needed = 0;

    for (pos = format; *pos; ++pos) {
        pos = strpbrk(pos, "{\\");
        if (!pos) {
            /* no more tokens, copy remainder of format string to output */
            space_needed += str_strlcpy(write, copy, space);
            break;
        }
        else {
            size_t bytes = pos - copy;
            /* found the start of a new token, copy `bytes` of lead text from [copy, pos) */
            space_needed += bytes;
            if (space > 0) {
                if (bytes >= space) {
                    bytes = space - 1;
                }
                str_strlcpy(write, copy, bytes + 1);
                write += bytes;
                space -= bytes;
            }
        }
        if (*pos == '{') {
            const char *token = pos + 1;

            copy = strchr(pos, '}');
            if (!copy) {
                /* syntax error: unterminated token */
                return 0;
            }
            else {
                /* found a token in the [token, copy) interval */
                size_t keylen = copy - token;
                size_t n;
                const char *val = NULL;
                for (n = 0; n != nparams; ++n) {
                    const char *key = params[n];
                    if (0 == strncmp(key, token, keylen)) {
                        /* param matches token? */
                        if (key[keylen] == '\0') {
                            val = key + keylen + 1;
                            break;
                        }
                    }
                }
                if (val) {
                    size_t slen = str_strlcpy(write, val, space);
                    space_needed += slen;
                    if (slen < space) {
                        space -= slen;
                        write += slen;
                    }
                    else {
                        /* buffer is full */
                        write += space - 1;
                        space = 0;
                    }
                }
                else {
                    /* token not found, copy [pos, copy] to output instead */
                    size_t bytes = keylen + 2;
                    space_needed += bytes;
                    if (bytes >= space) {
                        bytes = space - 1;
                    }
                    str_strlcpy(write, pos, bytes + 1);
                    write += bytes;
                    space -= bytes;
                }
                pos = copy++;
            }
        }
        else {
            /** backslash escapes the next character */
            ++space_needed;
            if (pos[1]) ++pos;
            if (space > 1) {
                *write++ = *pos;
                --space;
            }
            copy = pos + 1;
        }
    }
    if (copy < pos) {
        space_needed += str_strlcpy(write, copy, space);
    }
    return space_needed;
}